

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_filtering.cpp
# Opt level: O3

pair<double,_double>
anon_unknown.dwarf_124218::FilterFunctionTest(filterFunction Filter,uint32_t size)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t i;
  uint uVar3;
  uint8_t value;
  pair<double,_double> pVar4;
  Image output;
  TimerContainer timer;
  Image input;
  ImageTemplate<unsigned_char> local_a0;
  TimerContainer local_78;
  Image local_58;
  
  Performance_Test::TimerContainer::TimerContainer(&local_78);
  iVar1 = rand();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_a0,0,0,'\x01','\x01');
  value = '\x01';
  if ((uint8_t)iVar1 != '\0') {
    value = (uint8_t)iVar1;
  }
  Test_Helper::uniformImage(&local_58,value,size,size,&local_a0);
  local_a0._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_a0);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (&local_a0,local_58._width,local_58._height,'\x01','\x01');
  uVar3 = 0;
  while( true ) {
    uVar2 = Test_Helper::runCount();
    if (uVar2 <= uVar3) break;
    Performance_Test::TimerContainer::start(&local_78);
    (*Filter)(&local_58,&local_a0);
    Performance_Test::TimerContainer::stop(&local_78);
    uVar3 = uVar3 + 1;
  }
  pVar4 = Performance_Test::BaseTimerContainer::mean(&local_78.super_BaseTimerContainer);
  local_a0._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_a0);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  Performance_Test::TimerContainer::~TimerContainer(&local_78);
  return pVar4;
}

Assistant:

std::pair < double, double > FilterFunctionTest( filterFunction Filter, uint32_t size )
    {
        Performance_Test::TimerContainer timer;

        PenguinV_Image::Image input = Performance_Test::uniformImage( Performance_Test::randomValue<uint8_t>( 1, 256 ), size, size );
        PenguinV_Image::Image output( input.width(), input.height() );

        for( uint32_t i = 0; i < Performance_Test::runCount(); ++i ) {
            timer.start();

            Filter( input, output );

            timer.stop();
        }

        return timer.mean();
    }